

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallettool.cpp
# Opt level: O2

void wallet::WalletTool::WalletShowInfo(CWallet *wallet_instance)

{
  bool bVar1;
  uint uVar2;
  WalletDatabase *pWVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock4,&wallet_instance->cs_wallet,"wallet_instance->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallettool.cpp"
             ,100,false);
  tinyformat::format<>((ostream *)&std::cout,"Wallet info\n===========\n");
  tinyformat::format<std::__cxx11::string>
            ((ostream *)&std::cout,"Name: %s\n",&wallet_instance->m_name);
  pWVar3 = CWallet::GetDatabase(wallet_instance);
  (*pWVar3->_vptr_WalletDatabase[0xd])(&local_40,pWVar3);
  tinyformat::format<std::__cxx11::string>((ostream *)&std::cout,"Format: %s\n",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = CWallet::IsWalletFlagSet(wallet_instance,0x400000000);
  pcVar4 = "no";
  local_40._M_dataplus._M_p = "no";
  if (bVar1) {
    local_40._M_dataplus._M_p = "yes";
  }
  tinyformat::format<char_const*>((ostream *)&std::cout,"Descriptors: %s\n",(char **)&local_40);
  bVar1 = CWallet::IsCrypted(wallet_instance);
  local_40._M_dataplus._M_p = "no";
  if (bVar1) {
    local_40._M_dataplus._M_p = "yes";
  }
  tinyformat::format<char_const*>((ostream *)&std::cout,"Encrypted: %s\n",(char **)&local_40);
  bVar1 = CWallet::IsHDEnabled(wallet_instance);
  if (bVar1) {
    pcVar4 = "yes";
  }
  local_40._M_dataplus._M_p = pcVar4;
  tinyformat::format<char_const*>
            ((ostream *)&std::cout,"HD (hd seed available): %s\n",(char **)&local_40);
  uVar2 = CWallet::GetKeyPoolSize(wallet_instance);
  local_40._M_dataplus._M_p._0_4_ = uVar2;
  tinyformat::format<unsigned_int>((ostream *)&std::cout,"Keypool Size: %u\n",(uint *)&local_40);
  local_40._M_dataplus._M_p = (pointer)(wallet_instance->mapWallet)._M_h._M_element_count;
  tinyformat::format<unsigned_long>
            ((ostream *)&std::cout,"Transactions: %zu\n",(unsigned_long *)&local_40);
  local_40._M_dataplus._M_p =
       (pointer)(wallet_instance->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  tinyformat::format<unsigned_long>
            ((ostream *)&std::cout,"Address Book: %zu\n",(unsigned_long *)&local_40);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void WalletShowInfo(CWallet* wallet_instance)
{
    LOCK(wallet_instance->cs_wallet);

    tfm::format(std::cout, "Wallet info\n===========\n");
    tfm::format(std::cout, "Name: %s\n", wallet_instance->GetName());
    tfm::format(std::cout, "Format: %s\n", wallet_instance->GetDatabase().Format());
    tfm::format(std::cout, "Descriptors: %s\n", wallet_instance->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS) ? "yes" : "no");
    tfm::format(std::cout, "Encrypted: %s\n", wallet_instance->IsCrypted() ? "yes" : "no");
    tfm::format(std::cout, "HD (hd seed available): %s\n", wallet_instance->IsHDEnabled() ? "yes" : "no");
    tfm::format(std::cout, "Keypool Size: %u\n", wallet_instance->GetKeyPoolSize());
    tfm::format(std::cout, "Transactions: %zu\n", wallet_instance->mapWallet.size());
    tfm::format(std::cout, "Address Book: %zu\n", wallet_instance->m_address_book.size());
}